

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTigerWithCreaks.cpp
# Opt level: O1

double __thiscall
ProblemDecTigerWithCreaks::GetRewardForAgent
          (ProblemDecTigerWithCreaks *this,Index s,Index ja,Index agentI)

{
  Index IVar1;
  E *this_00;
  
  if (agentI != 1) {
    if (agentI != 0) goto LAB_003e56d3;
    if (s != 1) {
      if (s != 0) goto LAB_003e56d3;
      IVar1 = GetJointActionIndex(this,2,2);
      if (IVar1 == ja) {
        return 10.0;
      }
      IVar1 = GetJointActionIndex(this,1,1);
      if (IVar1 == ja) {
        return -100.0;
      }
      IVar1 = GetJointActionIndex(this,2,1);
      if (IVar1 == ja) {
        return 10.0;
      }
      IVar1 = GetJointActionIndex(this,1,2);
      if (IVar1 == ja) {
        return -100.0;
      }
      IVar1 = GetJointActionIndex(this,0,0);
      if (IVar1 == ja) {
        return -1.0;
      }
      IVar1 = GetJointActionIndex(this,0,2);
      if (IVar1 == ja) {
        return -1.0;
      }
      IVar1 = GetJointActionIndex(this,2,0);
      if (IVar1 == ja) {
        return 10.0;
      }
      IVar1 = GetJointActionIndex(this,0,1);
      if (IVar1 == ja) {
        return -1.0;
      }
      IVar1 = GetJointActionIndex(this,1,0);
      if (IVar1 == ja) {
        return -100.0;
      }
    }
    IVar1 = GetJointActionIndex(this,2,2);
    if (IVar1 == ja) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex(this,1,1);
    if (IVar1 == ja) {
      return 10.0;
    }
    IVar1 = GetJointActionIndex(this,2,1);
    if (IVar1 == ja) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex(this,1,2);
    if (IVar1 == ja) {
      return 10.0;
    }
    IVar1 = GetJointActionIndex(this,0,0);
    if (IVar1 == ja) {
      return -1.0;
    }
    IVar1 = GetJointActionIndex(this,0,2);
    if (IVar1 == ja) {
      return -1.0;
    }
    IVar1 = GetJointActionIndex(this,2,0);
    if (IVar1 == ja) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex(this,0,1);
    if (IVar1 == ja) {
      return -1.0;
    }
    IVar1 = GetJointActionIndex(this,1,0);
    if (IVar1 == ja) {
      return 10.0;
    }
  }
  if (s != 1) {
    if (s != 0) goto LAB_003e56d3;
    IVar1 = GetJointActionIndex(this,2,2);
    if (IVar1 == ja) {
      return 10.0;
    }
    IVar1 = GetJointActionIndex(this,1,1);
    if (IVar1 == ja) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex(this,2,1);
    if (IVar1 == ja) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex(this,1,2);
    if (IVar1 == ja) {
      return 10.0;
    }
    IVar1 = GetJointActionIndex(this,0,0);
    if (IVar1 == ja) {
      return -1.0;
    }
    IVar1 = GetJointActionIndex(this,0,2);
    if (IVar1 == ja) {
      return 10.0;
    }
    IVar1 = GetJointActionIndex(this,2,0);
    if (IVar1 == ja) {
      return -1.0;
    }
    IVar1 = GetJointActionIndex(this,0,1);
    if (IVar1 == ja) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex(this,1,0);
    if (IVar1 == ja) {
      return -1.0;
    }
  }
  IVar1 = GetJointActionIndex(this,2,2);
  if (IVar1 == ja) {
    return -100.0;
  }
  IVar1 = GetJointActionIndex(this,1,1);
  if (IVar1 == ja) {
    return 10.0;
  }
  IVar1 = GetJointActionIndex(this,2,1);
  if (IVar1 == ja) {
    return 10.0;
  }
  IVar1 = GetJointActionIndex(this,1,2);
  if (IVar1 == ja) {
    return -100.0;
  }
  IVar1 = GetJointActionIndex(this,0,0);
  if (IVar1 == ja) {
    return -1.0;
  }
  IVar1 = GetJointActionIndex(this,0,2);
  if (IVar1 == ja) {
    return -100.0;
  }
  IVar1 = GetJointActionIndex(this,2,0);
  if (IVar1 == ja) {
    return -1.0;
  }
  IVar1 = GetJointActionIndex(this,0,1);
  if (IVar1 == ja) {
    return 10.0;
  }
  IVar1 = GetJointActionIndex(this,1,0);
  if (IVar1 == ja) {
    return -1.0;
  }
LAB_003e56d3:
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"ProblemDecTigerWithCreaks::GetRewardForAgent should never get here");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

double ProblemDecTigerWithCreaks::GetRewardForAgent(Index s,
                                                    Index ja,
                                                    Index agentI) const
{
    switch(agentI)
    {
    case 0:
        switch(s)
        {
        case SLEFT:
        {
            if     (ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(LISTEN,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT)) return(-1);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN)) return(10);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT)) return(-1);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN)) return(-100);
        }
        case SRIGHT:
        {
            if     (ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(LISTEN,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT)) return(-1);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN)) return(-100);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT)) return(-1);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN)) return(10);
        }
        }
    case 1:
        switch(s)
        {
        case SLEFT:
        {
            if     (ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(LISTEN,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN)) return(-1);
        }
        case SRIGHT:
        {
            if     (ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(LISTEN,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN)) return(-1);
        }
        }
    }

    throw(E("ProblemDecTigerWithCreaks::GetRewardForAgent should never get here"));
    return(42);
}